

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall
QMainWindowLayoutState::unplug
          (QMainWindowLayoutState *this,QList<int> *path,QMainWindowLayoutState *other)

{
  int iVar1;
  Data *pDVar2;
  CutResult CVar3;
  QLayoutItem *pQVar4;
  QToolBarAreaLayout *other_00;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype p;
  QList<int> local_68;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  if (iVar1 == 1) {
    local_40 = 1;
    local_48 = -1;
    CVar3 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_40,&local_48);
    if (CVar3 < Full) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (int *)0x0;
      local_68.d.size = 0;
    }
    else if (CVar3 == Full) {
      local_68.d.d = (path->d).d;
      local_68.d.ptr = (path->d).ptr;
      local_68.d.size = (path->d).size;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr =
           (int *)QArrayData::allocate((QArrayData **)&local_68,4,0x10,local_48,KeepSize);
      local_68.d.size = local_48;
      pDVar2 = local_68.d.d;
      if (local_48 == 0) {
        local_68.d.size = 0;
      }
      else {
        memcpy(local_68.d.ptr,(path->d).ptr + local_40,local_48 * 4);
      }
      local_68.d.d = pDVar2;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
        }
      }
    }
    pQVar4 = QDockAreaLayout::unplug(&this->dockAreaLayout,&local_68);
  }
  else {
    if (iVar1 != 0) {
      pQVar4 = (QLayoutItem *)0x0;
      goto LAB_00439617;
    }
    local_40 = 1;
    local_48 = -1;
    CVar3 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_40,&local_48);
    if (CVar3 < Full) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (int *)0x0;
      local_68.d.size = 0;
    }
    else if (CVar3 == Full) {
      local_68.d.d = (path->d).d;
      local_68.d.ptr = (path->d).ptr;
      local_68.d.size = (path->d).size;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr =
           (int *)QArrayData::allocate((QArrayData **)&local_68,4,0x10,local_48,KeepSize);
      local_68.d.size = local_48;
      pDVar2 = local_68.d.d;
      if (local_48 == 0) {
        local_68.d.size = 0;
      }
      else {
        memcpy(local_68.d.ptr,(path->d).ptr + local_40,local_48 * 4);
      }
      local_68.d.d = pDVar2;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
        }
      }
    }
    other_00 = &other->toolBarAreaLayout;
    if (other == (QMainWindowLayoutState *)0x0) {
      other_00 = (QToolBarAreaLayout *)0x0;
    }
    pQVar4 = QToolBarAreaLayout::unplug(&this->toolBarAreaLayout,&local_68,other_00);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
    }
  }
LAB_00439617:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayoutState::unplug(const QList<int> &path, QMainWindowLayoutState *other)
{
    int i = path.first();

#if !QT_CONFIG(toolbar)
    Q_UNUSED(other);
#else
    if (i == 0)
        return toolBarAreaLayout.unplug(path.mid(1), other ? &other->toolBarAreaLayout : nullptr);
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.unplug(path.mid(1));
#endif // QT_CONFIG(dockwidget)

    return nullptr;
}